

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::AggregateFunction::
UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
          (AggregateFunction *__return_storage_ptr__,AggregateFunction *this,LogicalType *input_type
          ,LogicalType *return_type,FunctionNullHandling null_handling)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_51;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,__l,&local_51);
  AggregateFunction(__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_50,input_type
                    ,StateSize<duckdb::AvgState<duckdb::hugeint_t>>,
                    StateInitialize<duckdb::AvgState<duckdb::hugeint_t>,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
                    ,
                    UnaryScatterUpdate<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
                    ,
                    StateCombine<duckdb::AvgState<duckdb::hugeint_t>,duckdb::DiscreteAverageOperation>
                    ,
                    StateFinalize<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
                    ,(FunctionNullHandling)return_type,
                    UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
                    ,(bind_aggregate_function_t)0x0,(aggregate_destructor_t)0x0,
                    (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
                    (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  LogicalType::~LogicalType(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction
	UnaryAggregate(const LogicalType &input_type, LogicalType return_type,
	               FunctionNullHandling null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING) {
		return AggregateFunction({input_type}, return_type, AggregateFunction::StateSize<STATE>,
		                         AggregateFunction::StateInitialize<STATE, OP, destructor_type>,
		                         AggregateFunction::UnaryScatterUpdate<STATE, INPUT_TYPE, OP>,
		                         AggregateFunction::StateCombine<STATE, OP>,
		                         AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>, null_handling,
		                         AggregateFunction::UnaryUpdate<STATE, INPUT_TYPE, OP>);
	}